

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstream.c
# Opt level: O2

filepos_t MemSeek(memstream *p,filepos_t VirtualPos,int SeekMode)

{
  bool bVar1;
  uint __line;
  long lVar2;
  char *__assertion;
  
  if (SeekMode == 1) {
    lVar2 = 0x130;
  }
  else {
    if (SeekMode != 2) goto LAB_00123c0f;
    lVar2 = 0x138;
  }
  VirtualPos = VirtualPos + *(long *)((p->Base).URL + lVar2 + -0x20) + p->VirtualOffset;
LAB_00123c0f:
  if (VirtualPos < 0) {
    __assertion = "VirtualPos>=0";
    __line = 0x44;
  }
  else {
    lVar2 = p->VirtualOffset + p->Size;
    if ((VirtualPos <= lVar2) || (bVar1 = VirtualPos <= (long)p->Size, VirtualPos = lVar2, bVar1)) {
      p->Pos = VirtualPos - p->VirtualOffset;
      return VirtualPos;
    }
    __assertion = "VirtualPos<=(filepos_t)p->Size";
    __line = 0x4a;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/memstream.c"
                ,__line,"filepos_t MemSeek(memstream *, filepos_t, int)");
}

Assistant:

static filepos_t MemSeek(memstream* p,filepos_t VirtualPos,int SeekMode)
{
    switch (SeekMode)
    {
    default:
    case SEEK_SET: break;
    case SEEK_CUR: VirtualPos += p->Pos + p->VirtualOffset; break;
    case SEEK_END: VirtualPos += p->Size + p->VirtualOffset; break;
    }

    // TODO: these safety checks should return an error
    if (VirtualPos<0)
    {
        assert(VirtualPos>=0);
        VirtualPos=0;
    }

    if (VirtualPos>(filepos_t)p->Size + p->VirtualOffset)
    {
        assert(VirtualPos<=(filepos_t)p->Size);
        VirtualPos=p->Size + p->VirtualOffset;
    }

    p->Pos = (size_t)(VirtualPos - p->VirtualOffset);
    return VirtualPos;
}